

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3auxNextMethod(sqlite3_vtab_cursor *pCursor)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long *plVar4;
  long in_RDI;
  sqlite3_int64 v;
  int mc;
  int n;
  int eState;
  int iCol;
  char *aDoclist;
  int nDoclist;
  int i;
  int rc;
  Fts3Table *pFts3;
  Fts3auxCursor *pCsr;
  Fts3MultiSegReader *in_stack_00000050;
  Fts3Table *in_stack_00000058;
  int local_54;
  sqlite_int64 in_stack_ffffffffffffffb0;
  long lVar5;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int local_40;
  int local_3c;
  int local_28;
  int local_24;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  *(long *)(in_RDI + 0x90) = *(long *)(in_RDI + 0x90) + 1;
  *(int *)(in_RDI + 0x98) = *(int *)(in_RDI + 0x98) + 1;
  while (*(int *)(in_RDI + 0x98) < *(int *)(in_RDI + 0x9c)) {
    if (0 < *(long *)(*(long *)(in_RDI + 0xa0) + (long)*(int *)(in_RDI + 0x98) * 0x10)) {
      return 0;
    }
    *(int *)(in_RDI + 0x98) = *(int *)(in_RDI + 0x98) + 1;
  }
  local_24 = sqlite3Fts3SegReaderStep(in_stack_00000058,in_stack_00000050);
  if (local_24 == 100) {
    local_28 = 0;
    iVar1 = *(int *)(in_RDI + 0x58);
    lVar2 = *(long *)(in_RDI + 0x50);
    local_40 = 0;
    if (*(long *)(in_RDI + 0x78) != 0) {
      if (*(int *)(in_RDI + 0x80) < *(int *)(in_RDI + 0x48)) {
        local_54 = *(int *)(in_RDI + 0x80);
      }
      else {
        local_54 = *(int *)(in_RDI + 0x48);
      }
      in_stack_ffffffffffffffb8 =
           memcmp(*(void **)(in_RDI + 0x78),*(void **)(in_RDI + 0x40),(long)local_54);
      if ((in_stack_ffffffffffffffb8 < 0) ||
         ((in_stack_ffffffffffffffbc = local_54, in_stack_ffffffffffffffb8 == 0 &&
          (*(int *)(in_RDI + 0x80) < *(int *)(in_RDI + 0x48))))) {
        *(undefined4 *)(in_RDI + 0x88) = 1;
        return 0;
      }
    }
    iVar3 = fts3auxGrowStatArray
                      ((Fts3auxCursor *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),iVar3);
    if (iVar3 != 0) {
      return 7;
    }
    memset(*(void **)(in_RDI + 0xa0),0,(long)*(int *)(in_RDI + 0x9c) << 4);
    local_3c = 0;
    while (local_28 < iVar1) {
      lVar5 = 0;
      iVar3 = sqlite3Fts3GetVarint
                        ((char *)(lVar2 + local_28),(sqlite_int64 *)&stack0xffffffffffffffb0);
      local_28 = local_28 + iVar3;
      if (local_40 == 0) {
        **(long **)(in_RDI + 0xa0) = **(long **)(in_RDI + 0xa0) + 1;
        local_40 = 1;
        local_3c = 0;
      }
      else if (local_40 == 1) {
        if (1 < lVar5) {
          *(long *)(*(long *)(in_RDI + 0xa0) + 0x10) =
               *(long *)(*(long *)(in_RDI + 0xa0) + 0x10) + 1;
        }
        local_40 = 2;
LAB_001b4145:
        if (lVar5 == 0) {
          local_40 = 0;
        }
        else if (lVar5 == 1) {
          local_40 = 3;
        }
        else {
          lVar5 = *(long *)(in_RDI + 0xa0) + (long)(local_3c + 1) * 0x10;
          *(long *)(lVar5 + 8) = *(long *)(lVar5 + 8) + 1;
          *(long *)(*(long *)(in_RDI + 0xa0) + 8) = *(long *)(*(long *)(in_RDI + 0xa0) + 8) + 1;
        }
      }
      else {
        if (local_40 == 2) goto LAB_001b4145;
        local_3c = (int)lVar5;
        iVar3 = fts3auxGrowStatArray
                          ((Fts3auxCursor *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           (int)((ulong)lVar5 >> 0x20));
        if (iVar3 != 0) {
          return 7;
        }
        plVar4 = (long *)(*(long *)(in_RDI + 0xa0) + (long)(local_3c + 1) * 0x10);
        *plVar4 = *plVar4 + 1;
        local_40 = 2;
      }
    }
    *(undefined4 *)(in_RDI + 0x98) = 0;
    local_24 = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x88) = 1;
  }
  return local_24;
}

Assistant:

static int fts3auxNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts3auxCursor *pCsr = (Fts3auxCursor *)pCursor;
  Fts3Table *pFts3 = ((Fts3auxTable *)pCursor->pVtab)->pFts3Tab;
  int rc;

  /* Increment our pretend rowid value. */
  pCsr->iRowid++;

  for(pCsr->iCol++; pCsr->iCol<pCsr->nStat; pCsr->iCol++){
    if( pCsr->aStat[pCsr->iCol].nDoc>0 ) return SQLITE_OK;
  }

  rc = sqlite3Fts3SegReaderStep(pFts3, &pCsr->csr);
  if( rc==SQLITE_ROW ){
    int i = 0;
    int nDoclist = pCsr->csr.nDoclist;
    char *aDoclist = pCsr->csr.aDoclist;
    int iCol;

    int eState = 0;

    if( pCsr->zStop ){
      int n = (pCsr->nStop<pCsr->csr.nTerm) ? pCsr->nStop : pCsr->csr.nTerm;
      int mc = memcmp(pCsr->zStop, pCsr->csr.zTerm, n);
      if( mc<0 || (mc==0 && pCsr->csr.nTerm>pCsr->nStop) ){
        pCsr->isEof = 1;
        return SQLITE_OK;
      }
    }

    if( fts3auxGrowStatArray(pCsr, 2) ) return SQLITE_NOMEM;
    memset(pCsr->aStat, 0, sizeof(struct Fts3auxColstats) * pCsr->nStat);
    iCol = 0;

    while( i<nDoclist ){
      sqlite3_int64 v = 0;

      i += sqlite3Fts3GetVarint(&aDoclist[i], &v);
      switch( eState ){
        /* State 0. In this state the integer just read was a docid. */
        case 0:
          pCsr->aStat[0].nDoc++;
          eState = 1;
          iCol = 0;
          break;

        /* State 1. In this state we are expecting either a 1, indicating
        ** that the following integer will be a column number, or the
        ** start of a position list for column 0.  
        ** 
        ** The only difference between state 1 and state 2 is that if the
        ** integer encountered in state 1 is not 0 or 1, then we need to
        ** increment the column 0 "nDoc" count for this term.
        */
        case 1:
          assert( iCol==0 );
          if( v>1 ){
            pCsr->aStat[1].nDoc++;
          }
          eState = 2;
          /* fall through */

        case 2:
          if( v==0 ){       /* 0x00. Next integer will be a docid. */
            eState = 0;
          }else if( v==1 ){ /* 0x01. Next integer will be a column number. */
            eState = 3;
          }else{            /* 2 or greater. A position. */
            pCsr->aStat[iCol+1].nOcc++;
            pCsr->aStat[0].nOcc++;
          }
          break;

        /* State 3. The integer just read is a column number. */
        default: assert( eState==3 );
          iCol = (int)v;
          if( fts3auxGrowStatArray(pCsr, iCol+2) ) return SQLITE_NOMEM;
          pCsr->aStat[iCol+1].nDoc++;
          eState = 2;
          break;
      }
    }

    pCsr->iCol = 0;
    rc = SQLITE_OK;
  }else{
    pCsr->isEof = 1;
  }
  return rc;
}